

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inline.c
# Opt level: O2

int z(int fortytwo)

{
  my_abort();
  my_abort();
  return fortytwo * 3 * fortytwo * 3 + 9;
}

Assistant:

__attribute__((noinline)) int z(int fortytwo)
{
   return y(fortytwo * 2, fortytwo) + 9;
}